

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tztrans.cpp
# Opt level: O0

int __thiscall
icu_63::TimeZoneTransition::clone
          (TimeZoneTransition *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TimeZoneTransition *this_00;
  undefined8 local_30;
  TimeZoneTransition *this_local;
  
  this_00 = (TimeZoneTransition *)UMemory::operator_new((UMemory *)0x20,(size_t)__fn);
  local_30 = (TimeZoneTransition *)0x0;
  if (this_00 != (TimeZoneTransition *)0x0) {
    TimeZoneTransition(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

TimeZoneTransition*
TimeZoneTransition::clone(void) const {
    return new TimeZoneTransition(*this);
}